

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall
duckdb::RowGroup::MoveToCollection(RowGroup *this,RowGroupCollection *collection_p,idx_t new_start)

{
  bool bVar1;
  ColumnData *pCVar2;
  element_type *in_RDX;
  shared_ptr<duckdb::ColumnData,_true> *in_RDI;
  RowVersionManager *unaff_retaddr;
  optional_ptr<duckdb::RowVersionManager,_true> vinfo;
  shared_ptr<duckdb::ColumnData,_true> *column;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *__range1;
  RowGroup *in_stack_ffffffffffffffa8;
  RowVersionManager *local_48;
  RowGroup *in_stack_ffffffffffffffc0;
  __normal_iterator<duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
  local_30;
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_true> *local_28;
  element_type *local_20;
  element_type *local_18;
  shared_ptr<duckdb::ColumnData,_true> *new_start_00;
  
  local_18 = in_RDX;
  new_start_00 = in_RDI;
  ::std::reference_wrapper<duckdb::RowGroupCollection>::
  reference_wrapper<duckdb::RowGroupCollection&,void,duckdb::RowGroupCollection*>
            ((reference_wrapper<duckdb::RowGroupCollection> *)in_RDI,
             (RowGroupCollection *)in_stack_ffffffffffffffa8);
  in_RDI[2].internal.super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_20;
  (in_RDI->internal).super___shared_ptr<duckdb::ColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_18;
  local_28 = GetColumns(in_stack_ffffffffffffffc0);
  local_30._M_current =
       (shared_ptr<duckdb::ColumnData,_true> *)
       ::std::
       vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
       ::begin((vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                *)in_stack_ffffffffffffffa8);
  ::std::
  vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
  ::end((vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
         *)in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
                             *)in_stack_ffffffffffffffa8), bVar1) {
    __gnu_cxx::
    __normal_iterator<duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
    ::operator*(&local_30);
    pCVar2 = shared_ptr<duckdb::ColumnData,_true>::operator->(in_RDI);
    (*pCVar2->_vptr_ColumnData[4])(pCVar2,local_18);
    __gnu_cxx::
    __normal_iterator<duckdb::shared_ptr<duckdb::ColumnData,_true>_*,_std::vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>_>
    ::operator++(&local_30);
  }
  bVar1 = HasUnloadedDeletes(in_stack_ffffffffffffffa8);
  if (!bVar1) {
    local_48 = (RowVersionManager *)GetVersionInfo((RowGroup *)__begin1._M_current);
    bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&local_48);
    if (bVar1) {
      optional_ptr<duckdb::RowVersionManager,_true>::operator->
                ((optional_ptr<duckdb::RowVersionManager,_true> *)in_RDI);
      RowVersionManager::SetStart(unaff_retaddr,(idx_t)new_start_00);
    }
  }
  return;
}

Assistant:

void RowGroup::MoveToCollection(RowGroupCollection &collection_p, idx_t new_start) {
	this->collection = collection_p;
	this->start = new_start;
	for (auto &column : GetColumns()) {
		column->SetStart(new_start);
	}
	if (!HasUnloadedDeletes()) {
		auto vinfo = GetVersionInfo();
		if (vinfo) {
			vinfo->SetStart(new_start);
		}
	}
}